

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppConfig.h
# Opt level: O0

void __thiscall
ConfigManager::Configurations::AppConfig::AppConfig
          (AppConfig *this,
          map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *data)

{
  map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDI;
  map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff98;
  undefined1 local_40 [64];
  
  IConfigurationMap<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::IConfigurationMap((IConfigurationMap<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x10baf2);
  *(undefined ***)&(in_RDI->_M_t)._M_impl = &PTR__AppConfig_001a7e08;
  std::
  map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(in_RDI,in_stack_ffffffffffffff98);
  (**(code **)(*(long *)&(in_RDI->_M_t)._M_impl + 0x18))(in_RDI,local_40);
  std::
  map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x10bb2c);
  return;
}

Assistant:

explicit AppConfig(const std::map<Enums::Configurations, std::string> data)
        {
            SetConfigurationMap(data);
        }